

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int analyze_miniscript(char *miniscript,char **key_name_array,char **key_value_array,
                      size_t array_len,uint32_t target,uint32_t *network,uint32_t flags,
                      miniscript_node_t *prev_node,miniscript_node_t *parent_node,
                      miniscript_node_t **generate_node,char **script_ignore_checksum)

{
  char cVar1;
  miniscript_item_t *pmVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  miniscript_node_t *parent_node_00;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  longlong lVar9;
  uchar *bytes_out;
  long lVar10;
  uint32_t result;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  uint32_t uVar14;
  size_t sVar15;
  size_t __n;
  address_script_t *target_addr_item;
  long lVar16;
  bool bVar17;
  size_t buf_len_1;
  char *local_288;
  char *sub_str;
  size_t local_278;
  miniscript_node_t *child;
  size_t sub_str_len;
  size_t local_260;
  char **local_258;
  uint *local_250;
  miniscript_node_t *local_248;
  char **local_240;
  char *local_238;
  char *local_230;
  char work_checksum [12];
  char checksum [12];
  size_t buf_len;
  uchar privkey_bytes [38];
  uchar pubkey [65];
  char buffer [64];
  ext_key extkey;
  uchar local_88 [88];
  
  sub_str = (char *)0x0;
  sub_str_len = 0;
  child = (miniscript_node_t *)0x0;
  sVar5 = strlen(miniscript);
  parent_node_00 = (miniscript_node_t *)wally_malloc(0x80);
  if (parent_node_00 == (miniscript_node_t *)0x0) {
    return -3;
  }
  local_278 = array_len;
  local_258 = key_value_array;
  local_250 = network;
  local_240 = key_name_array;
  wally_bzero(parent_node_00,0x80);
  wally_bzero(buffer,0x40);
  wally_bzero(checksum,0xc);
  wally_bzero(work_checksum,0xc);
  if (parent_node != (miniscript_node_t *)0x0) {
    parent_node_00->parent = parent_node;
  }
  local_288 = parent_node_00->wrapper_str;
  sVar6 = 0;
  sVar13 = 0;
  iVar11 = 0;
  bVar17 = false;
  bVar3 = false;
  __n = 0;
  local_248 = (miniscript_node_t *)0x0;
LAB_00106999:
  if (__n == sVar5) goto LAB_00106c54;
  pmVar2 = parent_node_00->info;
  cVar1 = miniscript[__n];
  if ((pmVar2 == (miniscript_item_t *)0x0) && (cVar1 == ':')) {
    if (0xc < __n - sVar6) {
      __n = 0;
LAB_00106d17:
      iVar4 = -2;
      goto LAB_00106db9;
    }
    memcpy(local_288,miniscript + sVar6,__n - sVar6);
    sVar6 = __n + 1;
  }
  else {
    if (cVar1 == ',') {
      bVar3 = true;
      if (!(bool)(bVar17 & iVar11 == 1)) goto LAB_001069e9;
      iVar11 = 1;
LAB_00106ae2:
      sVar15 = __n - sVar13;
      local_260 = sVar13;
      iVar4 = realloc_substr_buffer(sVar15,&sub_str,&sub_str_len);
      if (iVar4 != 0) {
LAB_00107340:
        __n = 0;
        goto LAB_00106db9;
      }
      local_230 = sub_str;
      memcpy(sub_str,miniscript + local_260,sVar15);
      local_230[sVar15] = '\0';
      iVar4 = analyze_miniscript(local_230,local_240,local_258,local_278,target,local_250,flags,
                                 local_248,parent_node_00,&child,(char **)0x0);
      if (iVar4 != 0) goto LAB_00107340;
      local_248 = child;
      child = (miniscript_node_t *)0x0;
      pcVar8 = miniscript + __n;
      __n = __n + 1;
      sVar13 = local_260;
      if (*pcVar8 == ',') {
        sVar13 = __n;
        sVar6 = __n;
      }
      bVar3 = true;
      goto LAB_00106999;
    }
    if (cVar1 == ')') {
      bVar3 = true;
      if (iVar11 == 0) {
        iVar11 = 0;
      }
      else {
        iVar11 = iVar11 + -1;
        if ((bool)(iVar11 == 0 & bVar17)) {
          sVar6 = __n + 1;
          bVar17 = false;
          iVar11 = 0;
          goto LAB_00106ae2;
        }
      }
    }
    else {
      if (cVar1 == '(') {
        if (iVar11 == 0 && pmVar2 == (miniscript_item_t *)0x0) {
          memcpy(buffer,miniscript + sVar6,__n - sVar6);
          sVar6 = strlen(buffer);
          lVar16 = 0;
          while( true ) {
            if (lVar16 == 0x438) {
              parent_node_00->info = (miniscript_item_t *)0x0;
              goto LAB_00106c38;
            }
            uVar12 = *(uint *)((long)&miniscript_info_table[0].kind + lVar16);
            if (((uVar12 & target) != 0) &&
               (iVar4 = bcmp(buffer,*(void **)((long)&miniscript_info_table[0].name + lVar16),
                             sVar6 + 1), iVar4 == 0)) break;
            lVar16 = lVar16 + 0x28;
          }
          parent_node_00->info =
               (miniscript_item_t *)((long)&miniscript_info_table[0].name + lVar16);
          if ((parent_node_00->wrapper_str[0] != '\0') && ((uVar12 & 1) == 0)) {
LAB_00106c38:
            __n = 0;
            iVar4 = -2;
            goto LAB_00106db9;
          }
          sVar6 = __n + 1;
          bVar17 = true;
          sVar13 = sVar6;
        }
        iVar11 = iVar11 + 1;
        bVar3 = true;
        goto LAB_001069e9;
      }
      if (((parent_node == (miniscript_node_t *)0x0) && (cVar1 == '#')) &&
         ((iVar11 == 0 && !bVar17) && pmVar2 != (miniscript_item_t *)0x0)) {
        sVar5 = strlen(miniscript + __n + 1);
        if (0xb < sVar5) goto LAB_00106d17;
        memcpy(checksum,miniscript + __n + 1,sVar5);
        if (bVar3) goto LAB_00106c72;
        bVar17 = true;
        goto LAB_00106d40;
      }
    }
  }
LAB_001069e9:
  __n = __n + 1;
  goto LAB_00106999;
LAB_00106c54:
  if (bVar3) {
    __n = 0;
LAB_00106c72:
    pmVar2 = parent_node_00->info;
    iVar4 = 0;
    if (pmVar2 != (miniscript_item_t *)0x0) {
      if (((pmVar2->kind & 1) != 0) && (*local_288 != '\0')) {
        uVar12 = 0;
        for (lVar16 = 8; lVar16 != 0x198; lVar16 = lVar16 + 0x28) {
          pcVar8 = strchr(local_288,
                          (int)**(char **)((long)&g_network_address_table[4].segwit_prefix + lVar16)
                         );
          if (pcVar8 != (char *)0x0) {
            uVar12 = uVar12 | *(uint *)((long)&miniscript_wrapper_table[0].name + lVar16);
          }
        }
        parent_node_00->wrapper = uVar12;
      }
      iVar4 = 0;
      if (pmVar2->verify_function != (wally_verify_descriptor_t)0x0) {
        iVar4 = (*pmVar2->verify_function)(parent_node_00,parent_node);
      }
    }
  }
  else {
    local_238 = (char *)0x0;
    if (parent_node == (miniscript_node_t *)0x0) {
      bVar17 = true;
      __n = 0;
      if (miniscript != (char *)0x0) goto LAB_00106d40;
      iVar4 = -2;
    }
    else {
      __n = 0;
      iVar4 = -2;
      if ((miniscript != (char *)0x0) &&
         (bVar17 = false, parent_node->info != (miniscript_item_t *)0x0)) {
LAB_00106d40:
        local_238 = (char *)0x0;
        iVar4 = -2;
        if (*miniscript != '\0') {
          if (local_250 == (uint *)0x0) {
            target_addr_item = (address_script_t *)0x0;
          }
          else {
            lVar16 = 0;
            do {
              lVar10 = lVar16;
              if (lVar10 + 0x10 == 0x60) goto LAB_00106db9;
              lVar16 = lVar10 + 0x10;
            } while (*local_250 != (uint)(&g_network_address_table[0].network)[lVar10]);
            target_addr_item = (address_script_t *)(&g_network_address_table[0].network + lVar10);
          }
          sVar5 = strlen(miniscript);
          if ((bVar17) || (parent_node->info->kind != 0x40002)) {
            if (local_278 != 0) {
              for (sVar15 = 0; local_278 != sVar15; sVar15 = sVar15 + 1) {
                iVar11 = strncmp(miniscript,local_240[sVar15],sVar5 + 1);
                if (iVar11 == 0) {
                  pcVar8 = wally_strdup(local_258[sVar15]);
                  parent_node_00->data = pcVar8;
                  if (pcVar8 == (char *)0x0) {
                    iVar4 = -3;
                    goto LAB_00106db9;
                  }
                  sVar5 = strlen(pcVar8);
                  parent_node_00->data_size = (uint32_t)sVar5;
                  break;
                }
              }
            }
            pcVar8 = parent_node_00->data;
            if (pcVar8 == (char *)0x0) {
              pcVar8 = wally_strdup(miniscript);
              parent_node_00->data = pcVar8;
              parent_node_00->data_size = (uint32_t)sVar5;
            }
            if ((bVar17) ||
               (((iVar11 = parent_node->info->kind, 1 < iVar11 - 0x50001U && (iVar11 != 0x30001)) &&
                ((iVar11 != 0x60001 && (iVar11 != 0x40001)))))) {
              lVar9 = strtoll(pcVar8,&local_238,10);
              parent_node_00->number = lVar9;
              if ((local_238 == (char *)0x0) || (*local_238 == '\0')) {
                parent_node_00->kind = 8;
                uVar14 = 0x35101;
                if (lVar9 == 0) {
                  uVar14 = 0x3b901;
                }
                parent_node_00->type_properties = uVar14;
                goto LAB_00106c72;
              }
              sVar5 = strlen(parent_node_00->data);
              if ((bVar17) || (parent_node->info != (miniscript_item_t *)0x0)) {
                wally_bzero(&extkey,0xc0);
                pcVar8 = parent_node_00->data;
                if (*pcVar8 != '[') {
LAB_001071fe:
                  if ((flags & 1) == 0) {
                    if (((sVar5 == 0x82) || (sVar5 == 0x42)) &&
                       (iVar11 = wally_hex_to_bytes(parent_node_00->data,pubkey,0x41,&buf_len_1),
                       iVar11 == 0)) {
                      parent_node_00->kind = 0x1020;
                      if (sVar5 == 0x82) {
                        parent_node_00->is_uncompress_key = true;
                      }
LAB_001075b5:
                      iVar4 = wally_ec_public_key_verify(pubkey,buf_len_1);
                      goto LAB_001075c5;
                    }
                  }
                  else if ((sVar5 == 0x40) &&
                          (iVar11 = wally_hex_to_bytes(parent_node_00->data,pubkey,0x41,&buf_len_1),
                          iVar11 == 0)) {
                    parent_node_00->kind = 0x1020;
                    parent_node_00->is_xonly_key = true;
                    memmove(pubkey + 1,pubkey,buf_len_1);
                    pubkey[0] = '\x02';
                    buf_len_1 = buf_len_1 + 1;
                    goto LAB_001075b5;
                  }
                  iVar11 = wally_base58_to_bytes
                                     (parent_node_00->data,1,privkey_bytes,0x26,&buf_len_1);
                  if (buf_len_1 < 0x23 && iVar11 == 0) {
                    if ((target_addr_item == (address_script_t *)0x0) ||
                       (target_addr_item->version_wif == privkey_bytes[0])) {
                      if (buf_len_1 == 0x21) {
                        parent_node_00->kind = 0x2020;
                        parent_node_00->is_uncompress_key = true;
                        if ((flags & 1) == 0) {
LAB_00107478:
                          iVar4 = wally_ec_private_key_verify(privkey_bytes + 1,0x20);
                        }
                        else {
                          iVar4 = -2;
                        }
                      }
                      else {
                        iVar4 = -2;
                        if ((buf_len_1 == 0x22) && (privkey_bytes[0x21] == '\x01')) {
                          parent_node_00->kind = 0x2020;
                          if ((flags & 1) != 0) {
                            parent_node_00->is_xonly_key = true;
                          }
                          goto LAB_00107478;
                        }
                      }
                    }
                    else {
LAB_00107435:
                      iVar4 = -2;
                    }
                  }
                  else {
                    pcVar8 = strchr(parent_node_00->data,0x2f);
                    if (pcVar8 != (char *)0x0) {
                      if (pcVar8[1] == '/') goto LAB_00107435;
                      pcVar7 = wally_strdup(pcVar8);
                      parent_node_00->derive_path = pcVar7;
                      if (pcVar7 == (char *)0x0) goto LAB_00107575;
                      sVar5 = strlen(pcVar7);
                      parent_node_00->derive_path_len = (uint32_t)sVar5;
                      *pcVar8 = '\0';
                      pcVar8 = strchr(parent_node_00->derive_path,0x2a);
                      if (pcVar8 != (char *)0x0) {
                        parent_node_00->is_derive = true;
                      }
                    }
                    iVar4 = wally_base58_to_bytes(parent_node_00->data,1,local_88,0x52,&buf_len_1);
                    if ((iVar4 == 0) && (iVar4 = -2, buf_len_1 < 0x53)) {
                      iVar4 = bip32_key_unserialize(local_88,buf_len_1,&extkey);
                      if (iVar4 == 0) {
                        iVar4 = -2;
                        if (extkey.priv_key[0] == '\0') {
                          parent_node_00->kind = 0x14020;
                          if (extkey.version == 0x488ade4) goto LAB_0010754a;
LAB_001075f0:
                          if ((target_addr_item != (address_script_t *)0x0) &&
                             ((target_addr_item->network | 2) == 3)) goto LAB_001075c5;
                        }
                        else {
                          parent_node_00->kind = 0x24020;
                          if (extkey.version != 0x488b21e) goto LAB_001075f0;
LAB_0010754a:
                          if ((target_addr_item != (address_script_t *)0x0) &&
                             ((target_addr_item->network | 2) != 3)) goto LAB_001075c5;
                        }
                        if ((flags & 1) != 0) {
                          parent_node_00->is_xonly_key = true;
                        }
                        pcVar8 = parent_node_00->derive_path;
                        if (pcVar8 == (char *)0x0) {
                          iVar4 = 0;
                        }
                        else {
                          iVar4 = 0;
                          if (*pcVar8 != '\0') {
                            iVar4 = convert_bip32_path_to_array
                                              (pcVar8,(uint32_t *)0x0,
                                               (uint)(extkey.priv_key[0] == '\0'),false,
                                               (uint32_t *)0x0,(int8_t *)0x0);
                          }
                        }
                      }
                    }
                  }
                  goto LAB_001075c5;
                }
                pcVar7 = strchr(pcVar8,0x5d);
                if (pcVar7 != (char *)0x0) {
                  iVar11 = (int)pcVar7 - (int)pcVar8;
                  pcVar8 = (char *)wally_malloc((long)(iVar11 + 2));
                  parent_node_00->key_origin_info = pcVar8;
                  if (pcVar8 != (char *)0x0) {
                    uVar14 = iVar11 + 1;
                    sVar6 = (size_t)(int)uVar14;
                    memcpy(pcVar8,parent_node_00->data,sVar6);
                    parent_node_00->key_origin_info[sVar6] = '\0';
                    parent_node_00->key_origin_info_len = uVar14;
                    sVar5 = sVar5 - sVar6;
                    memmove(parent_node_00->data,pcVar7 + 1,sVar5);
                    parent_node_00->data[sVar5] = '\0';
                    goto LAB_001071fe;
                  }
LAB_00107575:
                  iVar4 = -3;
                  goto LAB_001075c5;
                }
              }
              iVar4 = -2;
            }
            else {
              bytes_out = (uchar *)wally_strdup(pcVar8);
              if (bytes_out == (uchar *)0x0) {
                iVar4 = -3;
                goto LAB_00106db9;
              }
              iVar4 = wally_hex_to_bytes(parent_node_00->data,bytes_out,sVar5,&buf_len);
              if (iVar4 == 0) {
                parent_node_00->kind = 4;
              }
              wally_free_string((char *)bytes_out);
            }
          }
          else {
            iVar4 = analyze_miniscript_addr
                              (miniscript,parent_node_00,parent_node,target_addr_item,(uchar *)0x0,0
                               ,(size_t *)0x0);
          }
LAB_001075c5:
          if (iVar4 == 0) goto LAB_00106c72;
        }
      }
    }
  }
LAB_00106db9:
  if ((((__n != 0) && (parent_node == (miniscript_node_t *)0x0)) && (iVar4 == 0)) &&
     (iVar4 = realloc_substr_buffer(__n + 1,&sub_str,&sub_str_len), pcVar8 = sub_str, iVar4 == 0)) {
    memcpy(sub_str,miniscript,__n);
    pcVar8[__n] = '\0';
    if (script_ignore_checksum != (char **)0x0) {
      pcVar7 = wally_strdup(pcVar8);
      *script_ignore_checksum = pcVar7;
    }
    iVar4 = generate_descriptor_checksum(pcVar8,work_checksum);
    if (iVar4 == 0) {
      iVar4 = (uint)(checksum._0_8_ == work_checksum._0_8_) * 2 + -2;
    }
  }
  if (((parent_node == (miniscript_node_t *)0x0) && (script_ignore_checksum != (char **)0x0)) &&
     (iVar4 == 0)) {
    if (__n == 0) {
      pcVar8 = wally_strdup(miniscript);
      *script_ignore_checksum = pcVar8;
    }
    else {
      pcVar8 = *script_ignore_checksum;
    }
    if (pcVar8 == (char *)0x0) {
      iVar4 = -3;
    }
    else {
LAB_00106e5c:
      if (parent_node_00->wrapper == 0) {
LAB_00107036:
        *generate_node = parent_node_00;
        if ((parent_node != (miniscript_node_t *)0x0) &&
           (parent_node->child == (miniscript_node_t *)0x0)) {
          parent_node->child = parent_node_00;
        }
        if (prev_node == (miniscript_node_t *)0x0) {
          parent_node_00->chain_count = 1;
        }
        else {
          parent_node_00->chain_count = prev_node->chain_count + 1;
          parent_node_00->back = prev_node;
          prev_node->next = parent_node_00;
        }
        iVar4 = 0;
        goto LAB_00106ed0;
      }
      sVar5 = strlen(local_288);
      do {
        bVar17 = sVar5 == 0;
        sVar5 = sVar5 - 1;
        if (bVar17) {
          iVar4 = check_type_properties(parent_node_00->type_properties);
          if (iVar4 == 0) goto LAB_00107036;
          break;
        }
        lVar16 = 0;
        do {
          lVar10 = lVar16;
          if (lVar10 + 0x28 == 0x1b8) {
            iVar4 = -2;
            goto LAB_00106ec5;
          }
          lVar16 = lVar10 + 0x28;
        } while (**(char **)((long)&miniscript_wrapper_table[0].name + lVar10) != local_288[sVar5]);
        iVar4 = (**(code **)((long)&miniscript_wrapper_table[0].verify_function + lVar10))
                          (parent_node_00,0);
      } while (iVar4 == 0);
    }
  }
  else if (iVar4 == 0) goto LAB_00106e5c;
LAB_00106ec5:
  free_miniscript_node(parent_node_00);
LAB_00106ed0:
  pcVar8 = sub_str;
  if (sub_str != (char *)0x0) {
    wally_bzero(sub_str,sub_str_len);
  }
  wally_free(pcVar8);
  return iVar4;
}

Assistant:

static int analyze_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t target,
    uint32_t *network,
    uint32_t flags,
    struct miniscript_node_t *prev_node,
    struct miniscript_node_t *parent_node,
    struct miniscript_node_t **generate_node,
    char **script_ignore_checksum)
{
    int ret = WALLY_OK;
    char *sub_str = NULL;
    size_t index;
    size_t str_len;
    size_t sub_str_len = 0;
    size_t offset = 0;
    size_t child_offset = 0;
    uint32_t indent = 0;
    bool collect_child = false;
    bool exist_indent = false;
    bool copy_child = false;
    char buffer[64];
    char checksum[12];
    char work_checksum[12];
    size_t checksum_len = 0;
    size_t checksum_index = 0;
    struct miniscript_node_t *node;
    struct miniscript_node_t *child = NULL;
    struct miniscript_node_t *prev_child = NULL;

    str_len = strlen(miniscript);

    node = (struct miniscript_node_t *) wally_malloc(sizeof(struct miniscript_node_t));
    if (!node)
        return WALLY_ENOMEM;

    wally_bzero(node, sizeof(struct miniscript_node_t));
    wally_bzero(buffer, sizeof(buffer));
    wally_bzero(checksum, sizeof(checksum));
    wally_bzero(work_checksum, sizeof(work_checksum));
    if (parent_node)
        node->parent = parent_node;

    for (index = 0; index < str_len; ++index) {
        if (!node->info && (miniscript[index] == ':')) {
            if (index - offset > sizeof(node->wrapper_str)) {
                ret = WALLY_EINVAL;
                break;
            }
            memcpy(node->wrapper_str, &miniscript[offset], index - offset);
            offset = index + 1;
        } else if (miniscript[index] == '(') {
            if (!node->info && (indent == 0)) {
                collect_child = true;
                memcpy(buffer, &miniscript[offset], index - offset);
                node->info = search_miniscript_info(buffer, target);
                if (!node->info) {
                    ret = WALLY_EINVAL;
                    break;
                } else if ((node->wrapper_str[0] != '\0') &&
                           ((node->info->kind & DESCRIPTOR_KIND_MINISCRIPT) == 0)) {
                    ret = WALLY_EINVAL;
                    break;
                }
                offset = index + 1;
                child_offset = offset;
            }
            ++indent;
            exist_indent = true;
        } else if (miniscript[index] == ')') {
            if (indent) {
                --indent;
                if (collect_child && (indent == 0)) {
                    collect_child = false;
                    offset = index + 1;
                    copy_child = true;
                }
            }
            exist_indent = true;
        } else if (miniscript[index] == ',') {
            if (collect_child && (indent == 1)) {
                copy_child = true;
            }
            exist_indent = true;
        } else if (miniscript[index] == '#') {
            if (!parent_node && node->info && !collect_child && (indent == 0)) {
                checksum_index = index;
                checksum_len = strlen(&miniscript[index + 1]);
                if (sizeof(checksum) > checksum_len) {
                    memcpy(checksum, &miniscript[index + 1], checksum_len);
                } else {
                    ret = WALLY_EINVAL;
                }
                break;  /* end */
            }
        }

        if (copy_child) {
            ret = realloc_substr_buffer(index - child_offset, &sub_str, &sub_str_len);
            if (ret != WALLY_OK)
                break;

            memcpy(sub_str, &miniscript[child_offset], index - child_offset);
            sub_str[index - child_offset] = '\0';
            ret = analyze_miniscript(sub_str,
                                     key_name_array,
                                     key_value_array,
                                     array_len,
                                     target,
                                     network,
                                     flags,
                                     prev_child,
                                     node,
                                     &child,
                                     NULL);
            if (ret != WALLY_OK)
                break;

            prev_child = child;
            child = NULL;
            copy_child = false;
            if (miniscript[index] == ',') {
                offset = index + 1;
                child_offset = offset;
            }
        }
    }

    if ((ret == WALLY_OK) && !exist_indent)
        ret = analyze_miniscript_value(miniscript,
                                       key_name_array,
                                       key_value_array,
                                       array_len,
                                       network,
                                       flags,
                                       node,
                                       parent_node);

    if ((ret == WALLY_OK) && node->info && (node->info->kind & DESCRIPTOR_KIND_MINISCRIPT) &&
        (node->wrapper_str[0] != '\0')) {
        node->wrapper = convert_miniscript_wrapper_flag(node->wrapper_str);
    }

    if ((ret == WALLY_OK) && node->info && node->info->verify_function)
        ret = node->info->verify_function(node, parent_node);

    if ((ret == WALLY_OK) && !parent_node && checksum_index) {
        /* check checksum */
        ret = realloc_substr_buffer(checksum_index + 1, &sub_str, &sub_str_len);
        if (ret == WALLY_OK) {
            memcpy(sub_str, miniscript, checksum_index);
            sub_str[checksum_index] = '\0';
            if (script_ignore_checksum)
                *script_ignore_checksum = wally_strdup(sub_str);

            ret = generate_descriptor_checksum(sub_str, work_checksum);
            if ((ret == WALLY_OK) && (memcmp(checksum, work_checksum, DESCRIPTOR_CHECKSUM_LENGTH) != 0)) {
                ret = WALLY_EINVAL;
            }
        }
    }
    if ((ret == WALLY_OK) && !parent_node && script_ignore_checksum) {
        if (!checksum_index)
            *script_ignore_checksum = wally_strdup(miniscript);

        if (*script_ignore_checksum == NULL)
            ret = WALLY_ENOMEM;
    }

    if ((ret == WALLY_OK) && node->wrapper) {
        const struct miniscript_wrapper_item_t *item = NULL;
        size_t len;
        size_t table_idx;
        size_t max;
        /* back from wrapper string */
        max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_item_t);
        len = strlen(node->wrapper_str);
        for (index = len; index > 0; --index) {
            item = NULL;
            for (table_idx = 0; table_idx < max; ++table_idx) {
                if (miniscript_wrapper_table[table_idx].name[0] == node->wrapper_str[index - 1]) {
                    item = &miniscript_wrapper_table[table_idx];
                    break;
                }
            }
            if (!item) {
                ret = WALLY_EINVAL;
                break;
            }

            ret = item->verify_function(node, NULL);
            if (ret != WALLY_OK)
                break;
        }
        if (ret == WALLY_OK)
            ret = check_type_properties(node->type_properties);
    }

    if (ret == WALLY_OK) {
        *generate_node = node;
        if (parent_node && !parent_node->child)
            parent_node->child = node;
        if (prev_node) {
            node->chain_count = prev_node->chain_count + 1;
            node->back = prev_node;
            prev_node->next = node;
        } else {
            node->chain_count = 1;
        }
    } else {
        free_miniscript_node(node);
    }

    if (sub_str)
        wally_bzero(sub_str, sub_str_len);
    wally_free(sub_str);
    return ret;
}